

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzD.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChNodeFEAxyzD::NodeIntStateGetIncrement
          (ChNodeFEAxyzD *this,uint off_x,ChState *x_new,ChState *x,uint off_v,ChStateDelta *Dv)

{
  double dVar1;
  double dVar2;
  CoeffReturnType pdVar3;
  Scalar *pSVar4;
  long lVar5;
  ulong index;
  
  for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
    index = (ulong)(off_x + (int)lVar5);
    pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x_new,index);
    dVar1 = *pdVar3;
    pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)x,index);
    dVar2 = *pdVar3;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Dv,
                        (ulong)(off_v + (int)lVar5));
    *pSVar4 = dVar1 - dVar2;
  }
  return;
}

Assistant:

void ChNodeFEAxyzD::NodeIntStateGetIncrement(const unsigned int off_x,
                                           const ChState& x_new,
                                           const ChState& x,
                                           const unsigned int off_v,
                                           ChStateDelta& Dv) {
    for (int i = 0; i < 6; ++i) {
        Dv(off_v + i) = x_new(off_x + i) - x(off_x + i);
    }
}